

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

uint ndiHexToUnsignedInt(char *string,int n)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  if (n < 1) {
    return 0;
  }
  uVar3 = 0;
  uVar2 = 0;
  while( true ) {
    cVar1 = string[uVar3];
    iVar4 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar4 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar4 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | iVar4 + cVar1;
    uVar3 = uVar3 + 1;
    if ((uint)n == uVar3) {
      return uVar2;
    }
  }
  return uVar2;
}

Assistant:

ndicapiExport unsigned int ndiHexToUnsignedInt(const char* string, int n)
{
  int i;
  unsigned int result = 0;
  int c;

  for (i = 0; i < n; i++)
  {
    c = string[i];
    if (c >= 'a' && c <= 'f')
    {
      result = (result << 4) | (c + (10 - 'a'));
    }
    else if (c >= 'A' && c <= 'F')
    {
      result = (result << 4) | (c + (10 - 'A'));
    }
    else if (c >= '0' && c <= '9')
    {
      result = (result << 4) | (c - '0');
    }
    else
    {
      break;
    }
  }

  return result;
}